

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAux.h
# Opt level: O0

void BamTools::SwapEndian_64(int64_t *x)

{
  int64_t *x_local;
  
  *x = *x >> 0x38 | (*x & 0xff00U) << 0x28 | (*x & 0xff0000U) << 0x18 | (*x & 0xff000000U) << 8 |
       *x >> 8 & 0xff000000U | *x >> 0x18 & 0xff0000U | *x >> 0x28 & 0xff00U | *x << 0x38;
  return;
}

Assistant:

API_EXPORT inline void SwapEndian_64(int64_t& x)
{
    x = ((x >> 56) | ((x << 40) & 0x00FF000000000000ll) | ((x << 24) & 0x0000FF0000000000ll) |
         ((x << 8) & 0x000000FF00000000ll) | ((x >> 8) & 0x00000000FF000000ll) |
         ((x >> 24) & 0x0000000000FF0000ll) | ((x >> 40) & 0x000000000000FF00ll) | (x << 56));
}